

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_impl.h
# Opt level: O3

shared_ptr<spdlog::logger> __thiscall
spdlog::
create<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::dateonly_daily_file_name_calculator>,std::__cxx11::string,int,int>
          (spdlog *this,string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int args_1,
          int args_2)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  registry_t<std::mutex> *logger_name_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<spdlog::logger> sVar3;
  shared_ptr<spdlog::sinks::sink> local_50;
  shared_ptr<spdlog::sinks::sink> *local_40;
  int local_38;
  int local_34;
  shared_ptr<spdlog::sinks::sink> **local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38 = args_2;
  local_34 = args_1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::dateonly_daily_file_name_calculator>,std::allocator<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::dateonly_daily_file_name_calculator>>,std::__cxx11::string&,int&,int&>
            (&local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (daily_file_sink<std::mutex,_spdlog::sinks::dateonly_daily_file_name_calculator> **)
             &local_50,
             (allocator<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::dateonly_daily_file_name_calculator>_>
              *)&local_40,args,&local_34,&local_38);
  this_00._M_pi =
       local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  peVar1 = local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  logger_name_00 = details::registry_t<std::mutex>::instance();
  if (local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_30 = &local_40;
  local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_40 = &local_50;
  sVar3 = details::registry_t<std::mutex>::create<std::shared_ptr<spdlog::sinks::sink>const*>
                    ((registry_t<std::mutex> *)this,(string *)logger_name_00,
                     (shared_ptr<spdlog::sinks::sink> **)logger_name,&local_40);
  _Var2 = sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar3.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<spdlog::logger> spdlog::create(const std::string &logger_name, Args... args)
{
    sink_ptr sink = std::make_shared<Sink>(args...);
    return details::registry::instance().create(logger_name, {sink});
}